

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

char * lore_describe_speed(uint8_t speed)

{
  bool bVar1;
  lore_speed *local_20;
  lore_speed *current;
  uint8_t speed_local;
  
  local_20 = lore_describe_speed::lore_speed_description;
  while( true ) {
    bVar1 = false;
    if (local_20->threshold != 0xff) {
      bVar1 = local_20->description != (char *)0x0;
    }
    if (!bVar1) break;
    if (local_20->threshold < speed) {
      return local_20->description;
    }
    local_20 = local_20 + 1;
  }
  return "erroneously";
}

Assistant:

static const char *lore_describe_speed(uint8_t speed)
{
	/* Value table ordered descending, for priority. Terminator is
	 * {UCHAR_MAX, NULL}. */
	static const struct lore_speed {
		uint8_t threshold;
		const char *description;
	} lore_speed_description[] = {
		{130,	"incredibly quickly"},
		{120,	"very quickly"},
		{115,	"quickly"},
		{110,	"fairly quickly"},
		{109,	"normal speed"}, /* 110 is normal speed */
		{99,	"slowly"},
		{89,	"very slowly"},
		{0,		"incredibly slowly"},
		{UCHAR_MAX,	NULL},
	};
	const struct lore_speed *current = lore_speed_description;

	while (current->threshold != UCHAR_MAX && current->description != NULL) {
		if (speed > current->threshold)
			return current->description;

		current++;
	}

	/* Return a weird description, since the value wasn't found in the table */
	return "erroneously";
}